

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O3

CURLcode Curl_shuffle_addr(Curl_easy *data,Curl_addrinfo **addr)

{
  undefined8 uVar1;
  ulong uVar2;
  CURLcode CVar3;
  Curl_addrinfo *pCVar4;
  undefined8 *puVar5;
  long lVar6;
  uchar *rnd;
  ulong uVar7;
  size_t num;
  size_t sVar8;
  long lVar9;
  
  pCVar4 = *addr;
  if (pCVar4 != (Curl_addrinfo *)0x0) {
    sVar8 = 0;
    num = 0;
    lVar9 = -1;
    do {
      lVar6 = lVar9;
      pCVar4 = pCVar4->ai_next;
      lVar9 = lVar6 + 1;
      num = num + 4;
      sVar8 = sVar8 + 8;
    } while (pCVar4 != (Curl_addrinfo *)0x0);
    if ((int)lVar9 != 0) {
      uVar7 = lVar6 + 2;
      Curl_infof(data,"Shuffling %i addresses",uVar7 & 0xffffffff);
      puVar5 = (undefined8 *)(*Curl_cmalloc)(sVar8);
      if (puVar5 != (undefined8 *)0x0) {
        *puVar5 = *addr;
        lVar6 = 0;
        do {
          puVar5[lVar6 + 1] = *(undefined8 *)(puVar5[lVar6] + 0x28);
          lVar6 = lVar6 + 1;
        } while (lVar9 != lVar6);
        rnd = (uchar *)(*Curl_cmalloc)(num);
        if (rnd == (uchar *)0x0) {
          CVar3 = CURLE_OUT_OF_MEMORY;
        }
        else {
          CVar3 = Curl_rand(data,rnd,num);
          if (CVar3 == CURLE_OK) {
            do {
              uVar2 = (ulong)*(uint *)(rnd + uVar7 * 4 + -4) % (uVar7 & 0xffffffff);
              uVar1 = puVar5[uVar2];
              puVar5[uVar2] = puVar5[uVar7 - 1];
              puVar5[uVar7 - 1] = uVar1;
              uVar7 = uVar7 - 1;
            } while (1 < (long)uVar7);
            lVar6 = 0;
            do {
              *(undefined8 *)(puVar5[lVar6] + 0x28) = puVar5[lVar6 + 1];
              lVar6 = lVar6 + 1;
            } while (lVar9 != lVar6);
            *(undefined8 *)(puVar5[lVar9] + 0x28) = 0;
            *addr = (Curl_addrinfo *)*puVar5;
          }
          (*Curl_cfree)(rnd);
          CVar3 = CURLE_OK;
        }
        (*Curl_cfree)(puVar5);
        return CVar3;
      }
      return CURLE_OUT_OF_MEMORY;
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_shuffle_addr(struct Curl_easy *data, Curl_addrinfo **addr)
{
  CURLcode result = CURLE_OK;
  const int num_addrs = Curl_num_addresses(*addr);

  if(num_addrs > 1) {
    Curl_addrinfo **nodes;
    infof(data, "Shuffling %i addresses", num_addrs);

    nodes = malloc(num_addrs*sizeof(*nodes));
    if(nodes) {
      int i;
      unsigned int *rnd;
      const size_t rnd_size = num_addrs * sizeof(*rnd);

      /* build a plain array of Curl_addrinfo pointers */
      nodes[0] = *addr;
      for(i = 1; i < num_addrs; i++) {
        nodes[i] = nodes[i-1]->ai_next;
      }

      rnd = malloc(rnd_size);
      if(rnd) {
        /* Fisher-Yates shuffle */
        if(Curl_rand(data, (unsigned char *)rnd, rnd_size) == CURLE_OK) {
          Curl_addrinfo *swap_tmp;
          for(i = num_addrs - 1; i > 0; i--) {
            swap_tmp = nodes[rnd[i] % (i + 1)];
            nodes[rnd[i] % (i + 1)] = nodes[i];
            nodes[i] = swap_tmp;
          }

          /* relink list in the new order */
          for(i = 1; i < num_addrs; i++) {
            nodes[i-1]->ai_next = nodes[i];
          }

          nodes[num_addrs-1]->ai_next = NULL;
          *addr = nodes[0];
        }
        free(rnd);
      }
      else
        result = CURLE_OUT_OF_MEMORY;
      free(nodes);
    }
    else
      result = CURLE_OUT_OF_MEMORY;
  }
  return result;
}